

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O0

Mtbdd __thiscall sylvan::Mtbdd::AbstractMin(Mtbdd *this,BddSet *variables)

{
  MTBDD from;
  MTBDD *in_RDX;
  BddSet *variables_local;
  Mtbdd *this_local;
  
  from = mtbdd_abstract_RUN(*(MTBDD *)variables,*in_RDX,mtbdd_abstract_op_min_CALL);
  Mtbdd(this,from);
  return (Mtbdd)(MTBDD)this;
}

Assistant:

Mtbdd
Mtbdd::AbstractMin(const BddSet &variables) const
{
    return mtbdd_abstract_min(mtbdd, variables.set.bdd);
}